

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void destroyTable(Parse *pParse,Table *pTab)

{
  int iVar1;
  int iVar2;
  int iDb;
  int iIdx;
  int iLargest;
  Index *pIdx;
  int iDestroyed;
  int iTab;
  Table *pTab_local;
  Parse *pParse_local;
  
  iVar1 = pTab->tnum;
  pIdx._0_4_ = 0;
  while( true ) {
    iDb = 0;
    if (((int)pIdx == 0) || (iVar1 < (int)pIdx)) {
      iDb = iVar1;
    }
    for (_iIdx = pTab->pIndex; _iIdx != (Index *)0x0; _iIdx = _iIdx->pNext) {
      iVar2 = _iIdx->tnum;
      if ((((int)pIdx == 0) || (iVar2 < (int)pIdx)) && (iDb < iVar2)) {
        iDb = iVar2;
      }
    }
    if (iDb == 0) break;
    iVar2 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    destroyRootPage(pParse,iDb,iVar2);
    pIdx._0_4_ = iDb;
  }
  return;
}

Assistant:

static void destroyTable(Parse *pParse, Table *pTab){
  /* If the database may be auto-vacuum capable (if SQLITE_OMIT_AUTOVACUUM
  ** is not defined), then it is important to call OP_Destroy on the
  ** table and index root-pages in order, starting with the numerically 
  ** largest root-page number. This guarantees that none of the root-pages
  ** to be destroyed is relocated by an earlier OP_Destroy. i.e. if the
  ** following were coded:
  **
  ** OP_Destroy 4 0
  ** ...
  ** OP_Destroy 5 0
  **
  ** and root page 5 happened to be the largest root-page number in the
  ** database, then root page 5 would be moved to page 4 by the 
  ** "OP_Destroy 4 0" opcode. The subsequent "OP_Destroy 5 0" would hit
  ** a free-list page.
  */
  int iTab = pTab->tnum;
  int iDestroyed = 0;

  while( 1 ){
    Index *pIdx;
    int iLargest = 0;

    if( iDestroyed==0 || iTab<iDestroyed ){
      iLargest = iTab;
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int iIdx = pIdx->tnum;
      assert( pIdx->pSchema==pTab->pSchema );
      if( (iDestroyed==0 || (iIdx<iDestroyed)) && iIdx>iLargest ){
        iLargest = iIdx;
      }
    }
    if( iLargest==0 ){
      return;
    }else{
      int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
      assert( iDb>=0 && iDb<pParse->db->nDb );
      destroyRootPage(pParse, iLargest, iDb);
      iDestroyed = iLargest;
    }
  }
}